

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buf_slot.cpp
# Opt level: O2

size_t mpp_buf_slot_get_size(MppBufSlots slots)

{
  size_t sVar1;
  AutoMutex auto_lock;
  
  if (slots == (MppBufSlots)0x0) {
    sVar1 = 0;
    _mpp_log_l(2,"mpp_buf_slot","found NULL input\n","mpp_buf_slot_get_size");
  }
  else {
    auto_lock.mLock = *slots;
    auto_lock.mEnabled = 1;
    if ((pthread_mutex_t *)auto_lock.mLock != (pthread_mutex_t *)0x0) {
      pthread_mutex_lock((pthread_mutex_t *)auto_lock.mLock);
    }
    sVar1 = *(size_t *)((long)slots + 0x58);
    Mutex::Autolock::~Autolock(&auto_lock);
  }
  return sVar1;
}

Assistant:

size_t mpp_buf_slot_get_size(MppBufSlots slots)
{
    if (NULL == slots) {
        mpp_err_f("found NULL input\n");
        return 0;
    }

    MppBufSlotsImpl *impl = (MppBufSlotsImpl *)slots;
    AutoMutex auto_lock(impl->lock);
    return impl->buf_size;
}